

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

float crnlib::quadratic_approx_filter(float t)

{
  float in_XMM0_Da;
  float fVar1;
  
  fVar1 = quadratic(in_XMM0_Da,0.5);
  return fVar1;
}

Assistant:

static float quadratic_approx_filter(float t) {
  return quadratic(t, .5f);
}